

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_uri_parameter(char *zFilename,char *zParam)

{
  long in_RSI;
  char *in_RDI;
  char *in_stack_fffffffffffffff8;
  char *pcVar1;
  
  if ((in_RDI == (char *)0x0) || (in_RSI == 0)) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = databaseName(in_RDI);
    pcVar1 = uriParameter(in_stack_fffffffffffffff8,pcVar1);
  }
  return pcVar1;
}

Assistant:

SQLITE_API const char *sqlite3_uri_parameter(const char *zFilename, const char *zParam){
  if( zFilename==0 || zParam==0 ) return 0;
  zFilename = databaseName(zFilename);
  return uriParameter(zFilename, zParam);
}